

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O1

void __thiscall
Nova::Grid_Iterator_Cell<float,_2>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_2> *this,Grid<float,_2> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  uint uVar1;
  T_Region TVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Range<int,_2> *pRVar7;
  Range<int,_2> *pRVar8;
  ulong uVar9;
  long lVar10;
  Range<int,_2> *pRVar11;
  Range<int,_2> domain;
  Range<int,_2> domain_copy;
  code *pcStack_50;
  Range<int,_2> local_48;
  T_STORAGE local_38;
  T_STORAGE TStack_30;
  
  pRVar7 = &local_48;
  pRVar8 = &local_48;
  pRVar11 = &local_48;
  pcStack_50 = (code *)0x11e672;
  Grid_Iterator<float,_2>::Grid_Iterator(&this->super_Grid_Iterator<float,_2>,grid_input);
  if (4 < (uint)side) {
    pcStack_50 = (code *)0x11e87f;
    __assert_fail("side>=0 && side<=2*d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xe,
                  "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                 );
  }
  if ((*region_type & ~Ghost_Region) == Boundary_Region) {
    pcStack_50 = (code *)0x11e89e;
    __assert_fail("(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xf,
                  "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                 );
  }
  pcStack_50 = (code *)0x11e69c;
  Grid<float,_2>::Cell_Indices
            ((Grid<float,_2> *)&local_48,(int)(this->super_Grid_Iterator<float,_2>).grid);
  TVar2 = *region_type;
  if (TVar2 == Boundary_Interior_Region) {
    if (side == 0) {
      local_38._M_elems = (_Type)local_48.min_corner._data._M_elems;
      TStack_30._M_elems = (_Type)local_48.max_corner._data._M_elems;
      lVar10 = 3;
      do {
        local_48.min_corner._data._M_elems[lVar10] = *(int *)((long)&pcStack_50 + lVar10 * 4);
        pcStack_50 = (code *)0x11e759;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_48);
        fVar3 = local_38._M_elems[lVar10];
        *(float *)((long)&pcStack_50 + lVar10 * 4) = fVar3;
        local_48.min_corner._data._M_elems[lVar10] = (int)fVar3;
        pcStack_50 = (code *)0x11e772;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_48);
        local_48.min_corner._data._M_elems[lVar10] = (int)fVar3 + -1;
        *(int *)((long)&pcStack_50 + lVar10 * 4) = local_48.max_corner._data._M_elems[lVar10] + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 == 2);
      goto LAB_0011e82e;
    }
    uVar1 = side - 1;
    uVar9 = (ulong)(uVar1 >> 1);
    if ((side & 1U) == 0) {
      if (3 < uVar1) {
LAB_0011e8bd:
        pcStack_50 = Grid_Iterator<float,_2>::Grid_Iterator;
        std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar9,2)
        ;
      }
      pRVar8 = (Range<int,_2> *)&local_48.max_corner;
    }
    else {
      if (3 < uVar1) goto LAB_0011e8bd;
      pRVar7 = (Range<int,_2> *)&local_48.max_corner;
    }
    (pRVar7->min_corner)._data._M_elems[uVar9] = (pRVar8->min_corner)._data._M_elems[uVar9];
  }
  else if (TVar2 == Whole_Region) {
    if (side != 0) {
      pcStack_50 = (code *)0x11e6d1;
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x14,
                    "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                   );
    }
  }
  else {
    if ((number_of_ghost_cells < 1) || (TVar2 != Ghost_Region)) {
      pcStack_50 = (code *)0x11e8bd;
      __assert_fail("(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x2e,
                    "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                   );
    }
    if (side == 0) {
      local_38._M_elems = (_Type)local_48.max_corner._data._M_elems;
      lVar10 = 4;
      do {
        *(undefined4 *)((long)local_48.max_corner._data._M_elems + lVar10) = 0;
        pcStack_50 = (code *)0x11e7b8;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_48);
        *(undefined4 *)((long)local_48.max_corner._data._M_elems + lVar10) =
             *(undefined4 *)((long)local_38._M_elems + lVar10);
        *(int *)((long)local_48.min_corner._data._M_elems + lVar10) =
             *(int *)((long)(((this->super_Grid_Iterator<float,_2>).grid)->counts)._data._M_elems +
                     lVar10) + 1;
        pcStack_50 = (code *)0x11e7da;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_48);
        *(undefined4 *)((long)local_48.max_corner._data._M_elems + lVar10) =
             *(undefined4 *)
              ((long)(((this->super_Grid_Iterator<float,_2>).grid)->counts)._data._M_elems + lVar10)
        ;
        *(undefined4 *)((long)local_48.min_corner._data._M_elems + lVar10) = 1;
        lVar10 = lVar10 + -4;
      } while (lVar10 == 0);
      goto LAB_0011e82e;
    }
    uVar9 = (ulong)(side - 1U >> 1);
    if ((side & 1U) == 0) {
      iVar6 = (((this->super_Grid_Iterator<float,_2>).grid)->counts)._data._M_elems[uVar9] + 1;
    }
    else {
      if (3 < side - 1U) goto LAB_0011e8bd;
      iVar6 = 0;
      pRVar11 = (Range<int,_2> *)&local_48.max_corner;
    }
    (pRVar11->min_corner)._data._M_elems[uVar9] = iVar6;
  }
  pcStack_50 = (code *)0x11e82e;
  Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_48);
LAB_0011e82e:
  iVar6 = (this->super_Grid_Iterator<float,_2>).number_of_regions;
  (this->super_Grid_Iterator<float,_2>).valid = 0 < iVar6;
  if (0 < iVar6) {
    (this->super_Grid_Iterator<float,_2>).current_region = 0;
    uVar4 = *(undefined8 *)
             (this->super_Grid_Iterator<float,_2>).regions[0].min_corner._data._M_elems;
    uVar5 = *(undefined8 *)
             (this->super_Grid_Iterator<float,_2>).regions[0].max_corner._data._M_elems;
    *(undefined8 *)(this->super_Grid_Iterator<float,_2>).region.min_corner._data._M_elems = uVar4;
    *(undefined8 *)(this->super_Grid_Iterator<float,_2>).region.max_corner._data._M_elems = uVar5;
    *(undefined8 *)(this->super_Grid_Iterator<float,_2>).index._data._M_elems = uVar4;
  }
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}